

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O2

void vu_float(t_vu *x,t_floatarg rms)

{
  int iVar1;
  float f;
  int iVar2;
  
  iVar1 = x->x_rms;
  iVar2 = 0;
  if (-99.9 < rms) {
    if (12.0 <= rms) {
      iVar2 = 0x28;
    }
    else {
      iVar2 = iemgui_vu_db2i[(int)(rms + 100.0 + rms + 100.0)];
    }
  }
  x->x_rms = iVar2;
  f = (float)((int)(rms * 100.0 + 10000.5) + -10000) * 0.01;
  x->x_fr = f;
  outlet_float((_outlet *)x->x_out_rms,f);
  x->field_0x4b8 = x->field_0x4b8 | 1;
  if (x->x_rms == iVar1) {
    return;
  }
  sys_queuegui(x,(x->x_gui).x_glist,vu_draw_update);
  return;
}

Assistant:

static void vu_float(t_vu *x, t_floatarg rms)
{
    int i;
    int old = x->x_rms;
    if(rms <= IEM_VU_MINDB)
        x->x_rms = 0;
    else if(rms >= IEM_VU_MAXDB)
        x->x_rms = IEM_VU_STEPS;
    else
    {
        int i = (int)(2.0*(rms + IEM_VU_OFFSET));
        x->x_rms = iemgui_vu_db2i[i];
    }
    i = (int)(100.0*rms + 10000.5);
    rms = 0.01*(t_float)(i - 10000);
    x->x_fr = rms;
    outlet_float(x->x_out_rms, rms);
    x->x_updaterms = 1;
    if(x->x_rms != old)
        sys_queuegui(x, x->x_gui.x_glist, vu_draw_update);
}